

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::wheelEvent(QMenu *this,QWheelEvent *e)

{
  QMenuPrivate *this_00;
  QWidgetData *pQVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  ulong local_38;
  QPoint local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    pQVar1 = (this->super_QWidget).data;
    local_28 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                        (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_30.xp.m_i = 0;
    local_30.yp.m_i = 0;
    uVar3 = QEventPoint::position();
    auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar7 = minpd(_DAT_0066f5d0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar4 = movmskpd(uVar3,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar4 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    local_38 = 0x80000000;
    if ((uVar4 & 2) != 0) {
      local_38 = (ulong)(uint)(int)auVar7._8_8_;
    }
    local_38 = local_38 | uVar5;
    cVar2 = QRect::contains(&local_30,SUB81(&local_38,0));
    if (cVar2 != '\0') {
      QMenuPrivate::scrollMenu(this_00,(*(int *)(e + 0x5c) < 1) + ScrollUp,false,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::wheelEvent(QWheelEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && rect().contains(e->position().toPoint()))
        d->scrollMenu(e->angleDelta().y() > 0 ?
                      QMenuPrivate::QMenuScroller::ScrollUp : QMenuPrivate::QMenuScroller::ScrollDown);
}